

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Rotation * __thiscall iDynTree::KinDynComputations::getBaseTwist(KinDynComputations *this)

{
  Twist *pTVar1;
  long in_RSI;
  Rotation *in_RDI;
  
  if (*(int *)(*(long *)(in_RSI + 8) + 4) == 2) {
    iDynTree::FreeFloatingPos::worldBasePos();
    pTVar1 = (Twist *)iDynTree::Transform::getRotation();
    iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Rotation::operator*(in_RDI,pTVar1);
  }
  else if (*(int *)(*(long *)(in_RSI + 8) + 4) == 1) {
    pTVar1 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Twist::Twist((Twist *)in_RDI,pTVar1);
  }
  else {
    pTVar1 = (Twist *)iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Transform::operator*((Transform *)in_RDI,pTVar1);
  }
  return in_RDI;
}

Assistant:

Twist KinDynComputations::getBaseTwist() const
{
    if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return pimpl->m_pos.worldBasePos().getRotation()*(pimpl->m_vel.baseVel());
    }
    else if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // Data is stored in body fixed
        return pimpl->m_vel.baseVel();
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        // inertial_X_base \ls^base v_base
        return pimpl->m_pos.worldBasePos()*(pimpl->m_vel.baseVel());
    }

    assert(false);
    return Twist::Zero();
}